

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

void __thiscall
cmListFileFunction::cmListFileFunction
          (cmListFileFunction *this,string *name,long line,long lineEnd,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_28.field_2._M_allocated_capacity = lineEnd;
  local_28.field_2._8_8_ = line;
  std::
  make_shared<cmListFileFunction::Implementation,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
            (&local_28,(long *)name,(long *)(local_28.field_2._M_local_buf + 8),
             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_28.field_2);
  sVar1 = local_28._M_string_length;
  local_28._M_string_length = 0;
  (this->Impl).
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28._M_dataplus._M_p;
  (this->Impl).
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
  local_28._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28._M_string_length);
  return;
}

Assistant:

cmListFileFunction(std::string name, long line, long lineEnd,
                     std::vector<cmListFileArgument> args)
    : Impl{ std::make_shared<Implementation>(std::move(name), line, lineEnd,
                                             std::move(args)) }
  {
  }